

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

fio_protocol_s * fio_protocol_try_lock(intptr_t uuid,fio_protocol_lock_e type)

{
  uint uVar1;
  int *piVar2;
  fio_protocol_lock_e type_local;
  intptr_t uuid_local;
  
  if (((uuid < 0) || (uVar1 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar1)) ||
     ((uuid & 0xffU) != (ulong)*(byte *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6d))) {
    piVar2 = __errno_location();
    *piVar2 = 9;
    uuid_local = 0;
  }
  else {
    uuid_local = (intptr_t)protocol_try_lock((long)(int)uVar1,type);
  }
  return (fio_protocol_s *)uuid_local;
}

Assistant:

fio_protocol_s *fio_protocol_try_lock(intptr_t uuid,
                                      enum fio_protocol_lock_e type) {
  if (!uuid_is_valid(uuid)) {
    errno = EBADF;
    return NULL;
  }
  return protocol_try_lock(fio_uuid2fd(uuid), type);
}